

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O3

void __thiscall
Reset_addResetThatHasAParentComponent_Test::~Reset_addResetThatHasAParentComponent_Test
          (Reset_addResetThatHasAParentComponent_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, addResetThatHasAParentComponent)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ResetPtr r = libcellml::Reset::create();

    EXPECT_EQ(size_t(0), c1->resetCount());
    EXPECT_EQ(size_t(0), c2->resetCount());

    // Add r to c1.
    EXPECT_TRUE(c1->addReset(r));
    EXPECT_EQ(size_t(1), c1->resetCount());
    EXPECT_EQ(size_t(0), c2->resetCount());

    // Add r to c2, which effectively moves it from c1 to c2.
    EXPECT_TRUE(c2->addReset(r));
    EXPECT_EQ(size_t(0), c1->resetCount());
    EXPECT_EQ(size_t(1), c2->resetCount());
}